

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcmake.cpp
# Opt level: O0

int __thiscall CTcMake::read_and_compare_config_str(CTcMake *this,CVmFile *fp,textchar_t *str)

{
  int iVar1;
  size_t sVar2;
  void *in_RDX;
  size_t cur;
  char buf [256];
  size_t len;
  CVmFile *in_stack_fffffffffffffed0;
  char *in_stack_fffffffffffffed8;
  CVmFile *in_stack_fffffffffffffee0;
  ulong local_28;
  void *local_20;
  int local_4;
  
  iVar1 = CVmFile::read_int2(in_stack_fffffffffffffed0);
  local_28 = (ulong)iVar1;
  if ((in_RDX == (void *)0x0) && (local_28 != 0)) {
    local_4 = 0;
  }
  else {
    sVar2 = get_strlen((textchar_t *)0x20b885);
    local_20 = in_RDX;
    if (local_28 == sVar2) {
      for (; local_28 != 0; local_28 = local_28 - sVar2) {
        sVar2 = 0x100;
        if (local_28 < 0x100) {
          sVar2 = local_28;
        }
        CVmFile::read_bytes(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,sVar2);
        iVar1 = memcmp(local_20,&stack0xfffffffffffffed8,local_28);
        if (iVar1 != 0) {
          return 0;
        }
        local_20 = (void *)(local_28 + (long)local_20);
      }
      local_4 = 1;
    }
    else {
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int CTcMake::read_and_compare_config_str(CVmFile *fp, const textchar_t *str)
{
    size_t len;

    /* read the length */
    len = (size_t)fp->read_int2();

    /* if the source string is null, the length must be zero to match */
    if (str == 0 && len != 0)
        return FALSE;

    /* if the lengths don't match, the strings can't match */
    if (len != get_strlen(str))
        return FALSE;

    /* keep going until we exhaust the string */
    while (len != 0)
    {
        char buf[256];
        size_t cur;

        /* read up to a buffer-full, or whatever remains if less */
        cur = sizeof(buf);
        if (len < cur)
            cur = len;

        /* read the data */
        fp->read_bytes(buf, cur);

        /* compare these bytes - if they differ, we don't have a match */
        if (memcmp(str, buf, len) != 0)
            return FALSE;

        /* skip past these bytes of the comparison string */
        str += len;

        /* deduct this amount from the remaining total length */
        len -= cur;
    }

    /* we didn't find any differences - they match */
    return TRUE;
}